

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O2

CreateExtkeyResponseStruct *
cfd::js::api::HDWalletStructApi::CreateExtkeyFromParent
          (CreateExtkeyResponseStruct *__return_storage_ptr__,
          CreateExtkeyFromParentRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&)>
  local_f8;
  CreateExtkeyResponseStruct local_d8;
  
  CreateExtkeyResponseStruct::CreateExtkeyResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:148:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtkeyFromParentRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_hdwallet.cpp:148:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"CreateExtkeyFromParent",&local_119);
  ExecuteStructApi<cfd::js::api::CreateExtkeyFromParentRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            (&local_d8,(api *)request,(CreateExtkeyFromParentRequestStruct *)&local_118,&local_f8,
             in_R8);
  CreateExtkeyResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

CreateExtkeyResponseStruct HDWalletStructApi::CreateExtkeyFromParent(
    const CreateExtkeyFromParentRequestStruct& request) {
  auto call_func = [](const CreateExtkeyFromParentRequestStruct& request)
      -> CreateExtkeyResponseStruct {
    CreateExtkeyResponseStruct response;
    const NetType net_type = AddressStructApi::ConvertNetType(request.network);
    ExtKeyType key_type = ConvertExtKeyType(request.extkey_type);
    HDWalletApi api;

    response.extkey = api.CreateExtkeyFromParent(
        request.extkey, net_type, key_type, request.child_number,
        request.hardened);

    return response;
  };

  CreateExtkeyResponseStruct result;
  result = ExecuteStructApi<
      CreateExtkeyFromParentRequestStruct, CreateExtkeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}